

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobject.cpp
# Opt level: O3

int __thiscall QMetaMethod::revision(QMetaMethod *this)

{
  uint *puVar1;
  uint *puVar2;
  undefined1 auVar3 [16];
  ulong uVar4;
  uint uVar5;
  
  uVar5 = 0;
  if ((this->mobj != (QMetaObject *)0x0) &&
     (puVar1 = (this->data).d, uVar5 = 0, (puVar1[4] & 0x80) != 0)) {
    puVar2 = (this->mobj->d).data;
    if ((int)*puVar2 < 0xd) {
      auVar3 = SEXT816(((long)puVar1 - (long)puVar2 >> 2) - (long)(int)puVar2[5]) *
               SEXT816(0x2aaaaaaaaaaaaaab);
      uVar4 = (ulong)(int)((auVar3._8_4_ + puVar2[5] + puVar2[4] * 6) - (auVar3._12_4_ >> 0x1f));
    }
    else {
      uVar4 = (ulong)(puVar1[2] - 1);
    }
    uVar5 = puVar2[uVar4];
  }
  return uVar5;
}

Assistant:

int QMetaMethod::revision() const
{
    if (!mobj)
        return 0;
    if ((data.flags() & MethodRevisioned) == 0)
        return 0;
#if QT_VERSION < QT_VERSION_CHECK(7, 0, 0)
    if (priv(mobj->d.data)->revision < 13) {
        // revision number located elsewhere
        int offset = priv(mobj->d.data)->methodData
                     + priv(mobj->d.data)->methodCount * Data::Size
                     + QMetaMethodPrivate::get(this)->ownMethodIndex();
        return mobj->d.data[offset];
    }
#endif

    return mobj->d.data[data.parameters() - 1];
}